

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O1

double __thiscall Vertex::getReactivePower(Vertex *this)

{
  pointer pCVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  
  pCVar1 = (this->capacitorsAlloc).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl
           .super__Vector_impl_data._M_start;
  dVar7 = (this->loadFactors).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
          super__Vector_impl_data._M_start[idLF].level * this->reactivePower;
  lVar5 = (long)(this->capacitorsAlloc).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
  if (lVar5 != 0) {
    uVar3 = (lVar5 >> 3) * -0x3333333333333333;
    pvVar2 = &pCVar1->powerSteps;
    uVar4 = 1;
    do {
      dVar7 = dVar7 - *(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
      uVar6 = (ulong)uVar4;
      pvVar2 = (vector<double,_std::allocator<double>_> *)((long)(pvVar2 + 1) + 0x10);
      uVar4 = uVar4 + 1;
    } while (uVar6 <= uVar3 && uVar3 - uVar6 != 0);
  }
  return dVar7;
}

Assistant:

double Vertex::getReactivePower(){
    double reactPower = this->loadFactors[ idLF ].level * this->reactivePower;
    for( unsigned int i = 0; i < capacitorsAlloc.size(); i++ ) {
        reactPower -= capacitorsAlloc[i].getPower();
    }
    return reactPower;
}